

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

HostAccessProtocol adios2::helper::GetHostAccessProtocol(string *valueStr)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  HostAccessProtocol HVar5;
  size_type sVar6;
  
  pcVar1 = (valueStr->_M_dataplus)._M_p;
  sVar2 = valueStr->_M_string_length;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    iVar4 = tolower((int)pcVar1[sVar6]);
    pcVar1[sVar6] = (char)iVar4;
  }
  bVar3 = std::operator==(valueStr,"ssh");
  if (bVar3) {
    HVar5 = SSH;
  }
  else {
    bVar3 = std::operator==(valueStr,"s3");
    if (bVar3) {
      HVar5 = S3;
    }
    else {
      bVar3 = std::operator==(valueStr,"xrootd");
      HVar5 = (uint)bVar3 * 2;
    }
  }
  return HVar5;
}

Assistant:

HostAccessProtocol GetHostAccessProtocol(std::string valueStr)
{
    std::transform(valueStr.begin(), valueStr.end(), valueStr.begin(), ::tolower);
    if (valueStr == "ssh")
    {
        return HostAccessProtocol::SSH;
    }
    else if (valueStr == "s3")
    {
        return HostAccessProtocol::S3;
    }
    else if (valueStr == "xrootd")
    {
        return HostAccessProtocol::XRootD;
    }
    return HostAccessProtocol::Invalid;
}